

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::shrSI8x16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *__return_storage_ptr___00;
  long lVar1;
  Literal *pLVar2;
  undefined1 local_1e8 [8];
  LaneArray<16> lanes;
  anon_union_16_5_9943fe1e_for_Literal_0 local_50;
  undefined8 local_40;
  Literal *local_38;
  
  local_38 = __return_storage_ptr__;
  if ((other->type).id != 2) {
    __assert_fail("shift.type == Type::i32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                  ,0x785,
                  "Literal wasm::shift(const Literal &, const Literal &) [Lanes = 16, IntoLanes = &wasm::Literal::getLanesSI8x16, ShiftOp = &wasm::Literal::shrS]"
                 );
  }
  getLanes<signed_char,16>((LaneArray<16> *)local_1e8,(wasm *)this,other);
  lVar1 = 0;
  __return_storage_ptr___00 = &lanes._M_elems[0xf].type;
  do {
    if ((other->type).id != 2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x118,"int32_t wasm::Literal::geti32() const");
    }
    pLVar2 = (Literal *)(local_1e8 + lVar1);
    local_50.i32 = (other->field_0).i32 & 7;
    local_40 = 2;
    shrS((Literal *)__return_storage_ptr___00,pLVar2,(Literal *)&local_50.func);
    if (pLVar2 != (Literal *)__return_storage_ptr___00) {
      ~Literal(pLVar2);
      Literal(pLVar2,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
    ~Literal((Literal *)&local_50.func);
    pLVar2 = local_38;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x180);
  Literal(local_38,(LaneArray<16> *)local_1e8);
  lVar1 = 0x168;
  do {
    ~Literal((Literal *)(local_1e8 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return pLVar2;
}

Assistant:

Literal Literal::shrSI8x16(const Literal& other) const {
  return shift<16, &Literal::getLanesSI8x16, &Literal::shrS>(*this, other);
}